

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

void __thiscall HighsLpRelaxation::resetToGlobalDomain(HighsLpRelaxation *this)

{
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  Highs::changeColsBounds
            (&this->lpsolver,0,this->mipsolver->model_->num_col_ + -1,
             *(double **)
              &((vector<double,_std::allocator<double>_> *)
               ((long)&(_Var1._M_head_impl)->domain + 0x308))->
               super__Vector_base<double,_std::allocator<double>_>,
             *(double **)
              &((vector<double,_std::allocator<double>_> *)
               ((long)&(_Var1._M_head_impl)->domain + 800))->
               super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void HighsLpRelaxation::resetToGlobalDomain() {
  lpsolver.changeColsBounds(0, mipsolver.numCol() - 1,
                            mipsolver.mipdata_->domain.col_lower_.data(),
                            mipsolver.mipdata_->domain.col_upper_.data());
}